

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O0

void __thiscall
SFFile::SetInstrumentGenerators(SFFile *this,SFGenComposite *composite,int start,int stop)

{
  int local_2c;
  SFGenList *pSStack_28;
  int i;
  SFGenList *gen;
  int stop_local;
  int start_local;
  SFGenComposite *composite_local;
  SFFile *this_local;
  
  local_2c = stop - start;
  for (pSStack_28 = this->InstrGenerators + start;
      (local_2c != 0 &&
      (((0x3a < pSStack_28->Oper || (0x32 < GenDefs[pSStack_28->Oper].StructIndex)) ||
       (*(anon_union_2_3_ea7ce7c6_for_SFGenList_1 *)
         (&composite->field_0 + GenDefs[pSStack_28->Oper].StructIndex) = pSStack_28->field_1,
       pSStack_28->Oper != 0x35)))); pSStack_28 = pSStack_28 + 1) {
    local_2c = local_2c + -1;
  }
  return;
}

Assistant:

void SFFile::SetInstrumentGenerators(SFGenComposite *composite, int start, int stop)
{
	// Proceed from first to last; later generators override earlier ones.
	SFGenList *gen = &InstrGenerators[start];
	for (int i = stop - start; i != 0; --i, ++gen)
	{
		if (gen->Oper >= GEN_NumGenerators)
		{ // Unknown generator.
			continue;
		}
		if (GenDefs[gen->Oper].StructIndex >= sizeof(SFGenComposite)/2)
		{ // Generator is either unused or ignored.
			continue;
		}
		// Set the generator
		((WORD *)composite)[GenDefs[gen->Oper].StructIndex] = gen->uAmount;
		if (gen->Oper == GEN_sampleID)
		{ // Anything past sampleID is ignored.
			break;
		}
	}
}